

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall
lest::message::message(message *this,text *kind_,location *where_,text *expr_,text *note_)

{
  text *info_;
  string *in_RCX;
  runtime_error *in_RDI;
  location *this_00;
  location *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  
  std::runtime_error::runtime_error(in_RDI,in_RCX);
  *(undefined ***)in_RDI = &PTR__message_00135cc8;
  std::__cxx11::string::string(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this_00 = (location *)(in_RDI + 0x30);
  location::location(this_00,in_stack_ffffffffffffff68);
  info_ = (text *)(in_RDI + 0x58);
  std::__cxx11::string::string(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  comment::comment((comment *)this_00,info_);
  std::__cxx11::string::~string(&this_00->file);
  return;
}

Assistant:

message( text kind_, location where_, text expr_, text note_ = "" )
    : std::runtime_error( expr_), kind( kind_), where( where_), note( note_) {}